

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O0

ULONG __thiscall
Js::StackTraceHelper::GetStackTrace
          (StackTraceHelper *this,ULONG framesToSkip,ULONG framesToCapture,void **stackFrames)

{
  code *pcVar1;
  anon_class_24_3_e4c234a9 fn;
  ULONG UVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined4 uStack_54;
  undefined4 local_44;
  ULONG local_40;
  ULONG i;
  ULONG capturedCount;
  StackBackTrace *local_30;
  StackBackTrace *stackTrace;
  void **ppvStack_20;
  AutoNestedHandledExceptionType autoNestedHandledExceptionType;
  void **stackFrames_local;
  ULONG framesToCapture_local;
  ULONG framesToSkip_local;
  StackTraceHelper *this_local;
  
  ppvStack_20 = stackFrames;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&stackTrace + 4),ExceptionType_DisableCheck);
  local_30 = GetStackBackTrace(this,framesToCapture);
  local_40 = StackBackTrace::Capture(local_30,framesToSkip);
  if (framesToCapture < local_40) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
                                ,0x44,"(capturedCount <= framesToCapture)",
                                "capturedCount <= framesToCapture");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_44 = 0;
  fn._12_4_ = uStack_54;
  fn.framesToCapture = framesToCapture;
  fn.i = &local_44;
  fn.stackFrames = ppvStack_20;
  StackBackTrace::Map<Js::StackTraceHelper::GetStackTrace(unsigned_int,unsigned_int,void**)::__0>
            (local_30,fn);
  UVar2 = local_40;
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&stackTrace + 4));
  return UVar2;
}

Assistant:

ULONG StackTraceHelper::GetStackTrace(ULONG framesToSkip, ULONG framesToCapture, void** stackFrames)
    {
#ifdef EXCEPTION_CHECK
        AutoNestedHandledExceptionType autoNestedHandledExceptionType(ExceptionType_DisableCheck);
#endif
        StackBackTrace* stackTrace = this->GetStackBackTrace(framesToCapture);
        ULONG capturedCount = stackTrace->Capture(framesToSkip);
        Assert(capturedCount <= framesToCapture);
        ULONG i = 0;
        stackTrace->Map([&i, framesToCapture, stackFrames](void* funcAddr){
            Assert(i <= framesToCapture);
            stackFrames[i++] = funcAddr;
        });
        return capturedCount;
    }